

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

bool __thiscall SessionManager::haveSession(SessionManager *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  reference ppSVar2;
  Mutex *in_RSI;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *in_RDI;
  iterator i;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  Slot *in_stack_ffffffffffffffa0;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> local_30 [3];
  Mutex *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  MutexLocker::MutexLocker((MutexLocker *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_30[0]._M_current =
       (Session **)
       std::vector<Session_*,_std::allocator<Session_*>_>::begin
                 ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffff98);
  do {
    std::vector<Session_*,_std::allocator<Session_*>_>::end
              ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      local_1 = 0;
LAB_001e8838:
      MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffffa0);
      return (bool)(local_1 & 1);
    }
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
              operator*(local_30);
    if (*ppSVar2 != (Session *)0x0) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
                operator*(local_30);
      in_stack_ffffffffffffffa0 = Session::getSlot(*ppSVar2);
      in_stack_ffffffffffffff98 = (Mutex *)Slot::getSlotID(in_stack_ffffffffffffffa0);
      if (in_stack_ffffffffffffff98 == local_18) {
        local_1 = 1;
        goto LAB_001e8838;
      }
    }
    __gnu_cxx::__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
    operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  } while( true );
}

Assistant:

bool SessionManager::haveSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() == slotID)
		{
			return true;
		}
	}

	return false;
}